

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
pybind11::cast<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,pybind11 *this,handle *handle)

{
  make_caster<std::__cxx11::basic_string<char>_> mStack_38;
  
  detail::load_type<std::__cxx11::string>(&mStack_38,(detail *)this,handle);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&mStack_38);
  std::__cxx11::string::~string((string *)&mStack_38);
  return __return_storage_ptr__;
}

Assistant:

T cast(const handle &handle) {
    static_assert(!detail::cast_is_temporary_value_reference<T>::value,
            "Unable to cast type to reference: value is local to type caster");
    using type_caster = detail::make_caster<T>;
    return detail::load_type<T>(handle).operator typename type_caster::template cast_op_type<T>();
}